

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_surrounded(void)

{
  ushort uVar1;
  wchar_t y2;
  chunk_conflict *c;
  monster_race *pmVar2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_kill *pbVar5;
  borg_grid *ag_00;
  loc_conflict grid;
  char *what;
  int local_6c;
  int local_68;
  int local_64;
  borg_grid *ag;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  wchar_t d;
  wchar_t ay;
  wchar_t ax;
  wchar_t y9;
  wchar_t x9;
  wchar_t adjacent_monsters;
  wchar_t monsters;
  wchar_t non_safe_grids;
  wchar_t safe_grids;
  monster_race *r_ptr;
  borg_kill *kill;
  
  adjacent_monsters = L'\0';
  x9 = L'\0';
  y9 = L'\0';
  for (y = L'\x01'; pmVar2 = r_info, y < borg_kills_nxt; y = y + L'\x01') {
    pbVar5 = borg_kills + y;
    uVar1 = pbVar5->r_idx;
    if ((pbVar5->r_idx != 0) && ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1))) {
      wVar4 = (pbVar5->pos).x;
      y2 = (pbVar5->pos).y;
      if (borg.c.x < wVar4) {
        local_64 = wVar4 - borg.c.x;
      }
      else {
        local_64 = borg.c.x - wVar4;
      }
      if (borg.c.y < y2) {
        local_68 = y2 - borg.c.y;
      }
      else {
        local_68 = borg.c.y - y2;
      }
      if (local_64 < local_68) {
        local_6c = local_68;
      }
      else {
        local_6c = local_64;
      }
      if ((((local_6c < 4) && (_Var3 = borg_los(borg.c.y,borg.c.x,y2,wVar4), _Var3)) &&
          ((pbVar5->awake & 1U) != 0)) &&
         ((_Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"), !_Var3
          && (_Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL"),
             !_Var3)))) {
        if (local_6c == 1) {
          y9 = y9 + L'\x01';
        }
        x9 = x9 + L'\x01';
      }
    }
  }
  for (y = L'\0'; c = cave, y < L'\b'; y = y + L'\x01') {
    ag_00 = borg_grids[borg.c.y + ddy_ddd[y]] + (borg.c.x + ddx_ddd[y]);
    grid = (loc_conflict)loc(borg.c.x + ddx_ddd[y],borg.c.y + ddy_ddd[y]);
    _Var3 = square_in_bounds_fully((chunk *)c,grid);
    if (_Var3) {
      _Var3 = borg_cave_floor_grid(ag_00);
      if (_Var3) {
        if (ag_00->feat == '\0') {
          adjacent_monsters = adjacent_monsters + L'\x01';
        }
        else if (ag_00->kill == '\0') {
          _Var3 = feat_is_shop((uint)ag_00->feat);
          if (_Var3) {
            adjacent_monsters = adjacent_monsters + L'\x01';
          }
        }
        else {
          adjacent_monsters = adjacent_monsters + L'\x01';
        }
      }
      else {
        adjacent_monsters = adjacent_monsters + L'\x01';
      }
      if (((ag_00->trap & 1U) != 0) && ((ag_00->glyph & 1U) == 0)) {
        adjacent_monsters = adjacent_monsters + L'\x01';
      }
    }
  }
  wVar4 = L'\b' - adjacent_monsters;
  if (((wVar4 != L'\x01') || (y9 != L'\x01')) && (wVar4 < x9)) {
    what = format("# Possibility of being surrounded (monsters/safegrids)(%d/%d)",(ulong)(uint)x9,
                  (ulong)(uint)wVar4);
    borg_note(what);
    if ((borg.goal.ignoring & 1U) == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_surrounded(void)
{
    borg_kill           *kill;
    struct monster_race *r_ptr;

    int safe_grids        = 8;
    int non_safe_grids    = 0;
    int monsters          = 0;
    int adjacent_monsters = 0;

    int x9, y9, ax, ay, d;
    int i;

    /* Evaluate the local monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        kill  = &borg_kills[i];
        r_ptr = &r_info[kill->r_idx];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        x9 = kill->pos.x;
        y9 = kill->pos.y;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* if the monster is too far then skip it. */
        if (d > 3)
            continue;

        /* if he cant see me then forget it.*/
        if (!borg_los(borg.c.y, borg.c.x, y9, x9))
            continue;

        /* if asleep, don't consider this one */
        if (!kill->awake)
            continue;

        /* Monsters with Pass Wall are dangerous, no escape from them */
        if (rf_has(r_ptr->flags, RF_PASS_WALL))
            continue;
        if (rf_has(r_ptr->flags, RF_KILL_WALL))
            continue;

        /* Cant really run away from Breeders very well */
        /* if (rf_has(r_ptr->flags, RF_MULTIPLY)) continue; */

        /* Monsters who never move cant surround */
        /* if (rf_has(r_ptr->flags, RF_NEVER_MOVE)) continue; */

        /* keep track of monsters touching me */
        if (d == 1)
            adjacent_monsters++;

        /* Add them up. */
        monsters++;
    }

    /* Evaluate the Non Safe Grids, (walls, closed doors, traps, monsters) */
    for (i = 0; i < 8; i++) {
        int x = borg.c.x + ddx_ddd[i];
        int y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        borg_grid *ag = &borg_grids[y][x];

        /* Bound check */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            continue;

        /* Skip walls/doors */
        if (!borg_cave_floor_grid(ag))
            non_safe_grids++;

        /* Skip unknown grids */
        else if (ag->feat == FEAT_NONE)
            non_safe_grids++;

        /* Skip monster grids */
        else if (ag->kill)
            non_safe_grids++;

        /* Mega-Hack -- skip stores XXX XXX XXX */
        else if (feat_is_shop(ag->feat))
            non_safe_grids++;

        /* Mega-Hack -- skip traps XXX XXX XXX */
        if (ag->trap && !ag->glyph)
            non_safe_grids++;
    }

    /* Safe grids are decreased */
    safe_grids = safe_grids - non_safe_grids;

    /* Am I in hallway? If so don't worry about it */
    if (safe_grids == 1 && adjacent_monsters == 1)
        return false;

    /* I am likely to get surrounded */
    if (monsters > safe_grids) {
        borg_note(format(
            "# Possibility of being surrounded (monsters/safegrids)(%d/%d)",
            monsters, safe_grids));

        /* The borg can get trapped by continuing to flee
         * into a dead-end.  So he needs to be able to trump this
         * routine.
         */
        if (borg.goal.ignoring) {
            /* borg_note("# Ignoring the fact that I am surrounded.");
             * return false;
             */
        } else
            return true;
    }

    /* Probably will not be surrounded */
    return false;
}